

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_make_transformation_translationv3(matrix4 *self,vector3 *translation)

{
  vector3 *translation_local;
  matrix4 *self_local;
  
  matrix4_identity(self);
  (self->field_0).m[3] = (translation->field_0).v[0];
  (self->field_0).m[7] = (translation->field_0).v[1];
  (self->field_0).m[0xb] = (translation->field_0).v[2];
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_translationv3(struct matrix4 *self, const struct vector3 *translation)
{
	matrix4_identity(self);

	self->c30 = translation->x;
	self->c31 = translation->y;
	self->c32 = translation->z;

	return self;
}